

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O1

void __thiscall
InterpreterTestSuite_PC_BrAddWrongLocalNwkDataFail_Test::TestBody
          (InterpreterTestSuite_PC_BrAddWrongLocalNwkDataFail_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  char *pcVar6;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  Expression expr;
  Value value;
  string brJsonDomainNameZeroXPan;
  string brJsonNwkNameZeroXPan;
  string brJsonDomainName;
  string brJsonNwkName;
  TestContext ctx;
  AssertHelper local_2e8;
  undefined8 *local_2e0;
  string local_2d8;
  Error local_2b8;
  undefined1 local_290 [8];
  _Alloc_hider local_288;
  undefined1 local_280 [8];
  char local_278 [16];
  _Alloc_hider local_268;
  char local_258 [16];
  Expression local_248;
  undefined1 local_228 [8];
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  TestContext local_160;
  
  InterpreterTestSuite::TestContext::TestContext(&local_160);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&local_160);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_180,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net1\",\n    }\n]"
             ,"");
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1a0,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"DomainName\": \"dom1\"\n    }\nn]"
             ,"");
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c0,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net1\",\n        \"ExtendedPanId\": 0,\n    }\n]"
             ,"");
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e0,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net1\",\n        \"ExtendedPanId\": 0,\n        \"DomainName\": \"dom1\"\n    }\n]"
             ,"");
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_220._M_p = (pointer)&local_210;
  local_228._0_4_ = kNone;
  local_218 = 0;
  local_210._M_local_buf[0] = '\0';
  local_200._M_p = (pointer)&local_1f0;
  local_1f8 = 0;
  local_1f0._M_local_buf[0] = '\0';
  paVar1 = &local_2d8.field_2;
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"./tmp/json.json","");
  ot::commissioner::WriteFile((Error *)local_290,&local_180,&local_2d8);
  puVar2 = (undefined8 *)&local_2b8.mMessage.field_2;
  local_2b8._0_8_ = (ulong)(uint)local_2b8._4_4_ << 0x20;
  local_2b8.mMessage._M_string_length = 0;
  local_2b8.mMessage.field_2._M_local_buf[0] = '\0';
  local_2b8.mMessage._M_dataplus._M_p = (pointer)puVar2;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::Error>
            ((internal *)&local_2e8,"WriteFile(brJsonNwkName, \"./tmp/json.json\")","Error{}",
             (Error *)local_290,&local_2b8);
  if (local_2b8.mMessage._M_dataplus._M_p != (pointer)puVar2) {
    operator_delete(local_2b8.mMessage._M_dataplus._M_p);
  }
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if (local_2e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_2e0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_2e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x93d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b8);
    if ((tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_290 !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_290 + 8))();
    }
  }
  puVar3 = local_2e0;
  if (local_2e0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2e0 != local_2e0 + 2) {
      operator_delete((undefined8 *)*local_2e0);
    }
    operator_delete(puVar3);
  }
  local_290 = (undefined1  [8])local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"br add ./tmp/json.json","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_2d8,&local_160.mInterpreter,(string *)local_290);
  local_2b8.mMessage._M_string_length =
       (size_type)
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.mMessage._M_dataplus._M_p =
       (pointer)local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_2b8._0_8_ =
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8._M_dataplus._M_p;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d8._M_string_length;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_2d8.field_2._M_allocated_capacity;
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d8);
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_290,&local_160.mInterpreter,&local_248);
  local_228._0_4_ = local_290._0_4_;
  std::__cxx11::string::operator=((string *)&local_220,(string *)&local_288);
  std::__cxx11::string::operator=((string *)&local_200,(string *)&local_268);
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  bVar5 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_228);
  local_2b8.mCode._0_1_ = !bVar5;
  local_2b8.mMessage._M_dataplus._M_p = (pointer)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_290,(internal *)&local_2b8,(AssertionResult *)0x2e6ffe,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x940,(char *)local_290);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if (local_290 != (undefined1  [8])local_280) {
      operator_delete((void *)local_290);
    }
    if ((long *)local_2d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2d8._M_dataplus._M_p + 8))();
    }
  }
  _Var4._M_p = local_2b8.mMessage._M_dataplus._M_p;
  if (local_2b8.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_2b8.mMessage._M_dataplus._M_p != local_2b8.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_2b8.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var4._M_p);
  }
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"./tmp/json.json","");
  ot::commissioner::WriteFile((Error *)local_290,&local_1c0,&local_2d8);
  local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
  local_2b8.mMessage._M_string_length = 0;
  local_2b8.mMessage.field_2._M_local_buf[0] = '\0';
  local_2b8.mMessage._M_dataplus._M_p = (pointer)puVar2;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::Error>
            ((internal *)&local_2e8,"WriteFile(brJsonNwkNameZeroXPan, \"./tmp/json.json\")",
             "Error{}",(Error *)local_290,&local_2b8);
  if (local_2b8.mMessage._M_dataplus._M_p != (pointer)puVar2) {
    operator_delete(local_2b8.mMessage._M_dataplus._M_p);
  }
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if (local_2e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_2e0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_2e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x942,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b8);
    if (local_290 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_290 + 8))();
    }
  }
  puVar3 = local_2e0;
  if (local_2e0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2e0 != local_2e0 + 2) {
      operator_delete((undefined8 *)*local_2e0);
    }
    operator_delete(puVar3);
  }
  local_290 = (undefined1  [8])local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"br add ./tmp/json.json","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_2d8,&local_160.mInterpreter,(string *)local_290);
  local_2b8.mMessage._M_string_length =
       (size_type)
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.mMessage._M_dataplus._M_p =
       (pointer)local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_2b8._0_8_ =
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8._M_dataplus._M_p;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d8._M_string_length;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_2d8.field_2._M_allocated_capacity;
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d8);
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_290,&local_160.mInterpreter,&local_248);
  local_228._0_4_ = local_290._0_4_;
  std::__cxx11::string::operator=((string *)&local_220,(string *)&local_288);
  std::__cxx11::string::operator=((string *)&local_200,(string *)&local_268);
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  bVar5 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_228);
  local_2b8.mCode._0_1_ = !bVar5;
  local_2b8.mMessage._M_dataplus._M_p = (pointer)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_290,(internal *)&local_2b8,(AssertionResult *)0x2e6ffe,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x945,(char *)local_290);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if (local_290 != (undefined1  [8])local_280) {
      operator_delete((void *)local_290);
    }
    if ((long *)local_2d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2d8._M_dataplus._M_p + 8))();
    }
  }
  _Var4._M_p = local_2b8.mMessage._M_dataplus._M_p;
  if (local_2b8.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_2b8.mMessage._M_dataplus._M_p != local_2b8.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_2b8.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var4._M_p);
  }
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"./tmp/json.json","");
  ot::commissioner::WriteFile((Error *)local_290,&local_1a0,&local_2d8);
  local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
  local_2b8.mMessage._M_string_length = 0;
  local_2b8.mMessage.field_2._M_local_buf[0] = '\0';
  local_2b8.mMessage._M_dataplus._M_p = (pointer)puVar2;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::Error>
            ((internal *)&local_2e8,"WriteFile(brJsonDomainName, \"./tmp/json.json\")","Error{}",
             (Error *)local_290,&local_2b8);
  if (local_2b8.mMessage._M_dataplus._M_p != (pointer)puVar2) {
    operator_delete(local_2b8.mMessage._M_dataplus._M_p);
  }
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if (local_2e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_2e0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_2e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x947,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b8);
    if (local_290 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_290 + 8))();
    }
  }
  puVar3 = local_2e0;
  if (local_2e0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2e0 != local_2e0 + 2) {
      operator_delete((undefined8 *)*local_2e0);
    }
    operator_delete(puVar3);
  }
  local_290 = (undefined1  [8])local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"br add ./tmp/json.json","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_2d8,&local_160.mInterpreter,(string *)local_290);
  local_2b8.mMessage._M_string_length =
       (size_type)
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.mMessage._M_dataplus._M_p =
       (pointer)local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_2b8._0_8_ =
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8._M_dataplus._M_p;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d8._M_string_length;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_2d8.field_2._M_allocated_capacity;
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d8);
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_290,&local_160.mInterpreter,&local_248);
  local_228._0_4_ = local_290._0_4_;
  std::__cxx11::string::operator=((string *)&local_220,(string *)&local_288);
  std::__cxx11::string::operator=((string *)&local_200,(string *)&local_268);
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  bVar5 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_228);
  local_2b8.mCode._0_1_ = !bVar5;
  local_2b8.mMessage._M_dataplus._M_p = (pointer)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_290,(internal *)&local_2b8,(AssertionResult *)0x2e6ffe,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x94a,(char *)local_290);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if (local_290 != (undefined1  [8])local_280) {
      operator_delete((void *)local_290);
    }
    if ((long *)local_2d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2d8._M_dataplus._M_p + 8))();
    }
  }
  _Var4._M_p = local_2b8.mMessage._M_dataplus._M_p;
  if (local_2b8.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_2b8.mMessage._M_dataplus._M_p != local_2b8.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_2b8.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var4._M_p);
  }
  local_2d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"./tmp/json.json","");
  ot::commissioner::WriteFile((Error *)local_290,&local_1e0,&local_2d8);
  local_2b8._0_8_ = local_2b8._0_8_ & 0xffffffff00000000;
  local_2b8.mMessage._M_string_length = 0;
  local_2b8.mMessage.field_2._M_local_buf[0] = '\0';
  local_2b8.mMessage._M_dataplus._M_p = (pointer)puVar2;
  testing::internal::CmpHelperEQ<ot::commissioner::Error,ot::commissioner::Error>
            ((internal *)&local_2e8,"WriteFile(brJsonDomainNameZeroXPan, \"./tmp/json.json\")",
             "Error{}",(Error *)local_290,&local_2b8);
  if (local_2b8.mMessage._M_dataplus._M_p != (pointer)puVar2) {
    operator_delete(local_2b8.mMessage._M_dataplus._M_p);
  }
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if (local_2e8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_2e0 == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (char *)*local_2e0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x94c,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2b8);
    if (local_290 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_290 + 8))();
    }
  }
  if (local_2e0 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_2e0 != local_2e0 + 2) {
      operator_delete((undefined8 *)*local_2e0);
    }
    operator_delete(local_2e0);
  }
  local_290 = (undefined1  [8])local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"br add ./tmp/json.json","");
  ot::commissioner::Interpreter::ParseExpression
            ((Expression *)&local_2d8,&local_160.mInterpreter,(string *)local_290);
  local_2b8.mMessage._M_string_length =
       (size_type)
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8.mMessage._M_dataplus._M_p =
       (pointer)local_248.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_2b8._0_8_ =
       local_248.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2d8._M_dataplus._M_p;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2d8._M_string_length;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_2d8.field_2._M_allocated_capacity;
  local_2d8._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d8);
  if (local_290 != (undefined1  [8])local_280) {
    operator_delete((void *)local_290);
  }
  ot::commissioner::Interpreter::Eval((Value *)local_290,&local_160.mInterpreter,&local_248);
  local_228._0_4_ = local_290._0_4_;
  std::__cxx11::string::operator=((string *)&local_220,(string *)&local_288);
  std::__cxx11::string::operator=((string *)&local_200,(string *)&local_268);
  if (local_268._M_p != local_258) {
    operator_delete(local_268._M_p);
  }
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  bVar5 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_228);
  local_2b8.mCode._0_1_ = !bVar5;
  local_2b8.mMessage._M_dataplus._M_p = (pointer)0x0;
  if (bVar5) {
    testing::Message::Message((Message *)&local_2d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_290,(internal *)&local_2b8,(AssertionResult *)0x2e6ffe,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x94f,(char *)local_290);
    testing::internal::AssertHelper::operator=(&local_2e8,(Message *)&local_2d8);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    if (local_290 != (undefined1  [8])local_280) {
      operator_delete((void *)local_290);
    }
    if ((long *)local_2d8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_2d8._M_dataplus._M_p + 8))();
    }
  }
  _Var4._M_p = local_2b8.mMessage._M_dataplus._M_p;
  if (local_2b8.mMessage._M_dataplus._M_p != (pointer)0x0) {
    if (*local_2b8.mMessage._M_dataplus._M_p != local_2b8.mMessage._M_dataplus._M_p + 0x10) {
      operator_delete(*local_2b8.mMessage._M_dataplus._M_p);
    }
    operator_delete(_Var4._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != &local_1f0) {
    operator_delete(local_200._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_p != &local_210) {
    operator_delete(local_220._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  InterpreterTestSuite::TestContext::~TestContext(&local_160);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrAddWrongLocalNwkDataFail)
{
    TestContext ctx;
    InitContext(ctx);

    std::string brJsonNwkName            = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net1\",\n\
    }\n\
]";
    std::string brJsonDomainName         = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"DomainName\": \"dom1\"\n\
    }\n\
n]";
    std::string brJsonNwkNameZeroXPan    = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net1\",\n\
        \"ExtendedPanId\": 0,\n\
    }\n\
]";
    std::string brJsonDomainNameZeroXPan = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net1\",\n\
        \"ExtendedPanId\": 0,\n\
        \"DomainName\": \"dom1\"\n\
    }\n\
]";

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_EQ(WriteFile(brJsonNwkName, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonNwkNameZeroXPan, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonDomainName, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonDomainNameZeroXPan, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());
}